

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gbabus.c
# Opt level: O1

void gba_write_word_cold_18(void)

{
  fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
          "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/mem/gbabus.c",0x298);
  fwrite("Fatal error- should not have ended up here.\n\x1b[0;m",0x31,1,_stderr);
  exit(1);
}

Assistant:

INLINE void write_word_ioreg_masked(word addr, word value, word mask) {
    word maskedaddr = addr & 0xFFF;
    switch (maskedaddr) {
        case IO_FIFO_A:
            write_fifo(apu, 0, value, mask);
            break;
        case IO_FIFO_B:
            write_fifo(apu, 1, value, mask);
            break;
        case IO_BG2X:
        case IO_BG2Y:
        case IO_BG3X:
        case IO_BG3Y: {
            word* current = NULL;
            word* initial = NULL;
            switch (maskedaddr) {
                case IO_BG2X:
                    current = &ppu->BG2X.current.raw;
                    initial = &ppu->BG2X.initial.raw;
                    break;
                case IO_BG2Y:
                    current = &ppu->BG2Y.current.raw;
                    initial = &ppu->BG2Y.initial.raw;
                    break;
                case IO_BG3X:
                    current = &ppu->BG3X.current.raw;
                    initial = &ppu->BG3X.initial.raw;
                    break;
                case IO_BG3Y:
                    current = &ppu->BG3Y.current.raw;
                    initial = &ppu->BG3Y.initial.raw;
                    break;
                default:
                    logfatal("Fatal error- should not have ended up here.")
            }
            // Only update "current" if is VBlank
            if (!is_vblank(ppu)) {
                *current &= (~mask);
                *current |= (value & mask);
            }
            *initial &= (~mask);
            *initial |= (value & mask);
            break;
        }
        default:
            if (!is_ioreg_writable(addr)) {
                logwarn("Ignoring write to unwriteable word ioreg 0x%08X", addr)
                return;
            }
            word* ioreg = get_word_ioreg_ptr(addr);
            if (ioreg) {
                *ioreg &= (~mask);
                *ioreg |= (value & mask);
            } else {
                logwarn("Ignoring write to word ioreg 0x%08X with mask 0x%08X", addr, mask)
            }
    }
}